

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O3

Matrix2f __thiscall Matrix2f::inverse(Matrix2f *this,bool *pbIsSingular,float epsilon)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 *in_RDX;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar8;
  undefined1 auVar7 [16];
  float fVar9;
  Matrix2f MVar10;
  
  fVar6 = *(float *)(pbIsSingular + 4);
  uVar1 = *(uint *)pbIsSingular;
  uVar2 = *(uint *)(pbIsSingular + 0xc);
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * *(float *)(pbIsSingular + 8))),ZEXT416(uVar1),
                           ZEXT416(uVar2));
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(auVar7,auVar4);
  if (auVar4._0_4_ < epsilon) {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    auVar7._0_12_ = ZEXT812(0);
    auVar7._12_4_ = 0;
    *(undefined1 (*) [16])this->m_elements = auVar7;
    return (float  [4])(ZEXT416(uVar1) << 0x40);
  }
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar4 = vxorps_avx512vl(ZEXT416((uint)*(float *)(pbIsSingular + 8)),auVar5);
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = 0;
  }
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(ZEXT416((uint)fVar6),auVar3);
  fVar9 = 1.0 / auVar7._0_4_;
  auVar7 = vunpcklps_avx(ZEXT416(uVar2),auVar5);
  auVar7 = vinsertps_avx(auVar7,auVar4,0x20);
  auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
  fVar6 = fVar9 * auVar7._0_4_;
  fVar8 = fVar9 * auVar7._4_4_;
  *(undefined1 (*) [16])this->m_elements =
       CONCAT412(fVar9 * auVar7._12_4_,CONCAT48(fVar9 * auVar7._8_4_,CONCAT44(fVar8,fVar6)));
  MVar10.m_elements[2] = (float)uVar1;
  MVar10.m_elements[0] = fVar6;
  MVar10.m_elements[1] = fVar8;
  MVar10.m_elements[3] = 0.0;
  return (Matrix2f)MVar10.m_elements;
}

Assistant:

Matrix2f Matrix2f::inverse( bool* pbIsSingular, float epsilon )
{
	float determinant = m_elements[ 0 ] * m_elements[ 3 ] - m_elements[ 2 ] * m_elements[ 1 ];

	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix2f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix2f
		(
			m_elements[ 3 ] * reciprocalDeterminant, -m_elements[ 2 ] * reciprocalDeterminant,
			-m_elements[ 1 ] * reciprocalDeterminant, m_elements[ 0 ] * reciprocalDeterminant
		);
	}
}